

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.cpp
# Opt level: O2

AggregateFunction * duckdb::StdDevSampFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_R8B;
  LogicalType local_40;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,DOUBLE);
  LogicalType::LogicalType(&local_40,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::StddevState,double,double,duckdb::STDDevSampOperation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,&local_40,(LogicalType *)0x0,
             in_R8B);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  return in_RDI;
}

Assistant:

AggregateFunction StdDevSampFun::GetFunction() {
	return AggregateFunction::UnaryAggregate<StddevState, double, double, STDDevSampOperation>(LogicalType::DOUBLE,
	                                                                                           LogicalType::DOUBLE);
}